

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::SolverState::Clear(SolverState *this)

{
  bool bVar1;
  string *default_value;
  LogMessage *other;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  SolverState *local_40;
  SolverState *this_local;
  InternalMetadataWithArena *local_30;
  InternalMetadataWithArena *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_40 = this;
  google::protobuf::RepeatedPtrField<caffe::BlobProto>::Clear(&this->history_);
  bVar1 = has_learned_net(this);
  if (bVar1) {
    default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->learned_net_,default_value)
    ;
    local_79 = 0;
    if (bVar1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                 ,0x27c9);
      local_79 = 1;
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_78,
                         "CHECK failed: !learned_net_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                        );
      google::protobuf::internal::LogFinisher::operator=(local_8d,other);
    }
    if ((local_79 & 1) != 0) {
      google::protobuf::internal::LogMessage::~LogMessage(&local_78);
    }
    google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_
              (&this->learned_net_);
    std::__cxx11::string::clear();
  }
  local_18 = &this->_has_bits_;
  local_1c = 0;
  if ((local_18->has_bits_[0] & 6) != 0) {
    memset(&this->iter_,0,8);
  }
  this_local = (SolverState *)&this->_has_bits_;
  memset(this_local,0,4);
  local_30 = &this->_internal_metadata_;
  if (((uint)(local_30->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_28 = local_30;
    local_10 = local_30;
    google::protobuf::internal::InternalMetadataWithArena::DoClear(local_30);
  }
  return;
}

Assistant:

void SolverState::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.SolverState)
  history_.Clear();
  if (has_learned_net()) {
    GOOGLE_DCHECK(!learned_net_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
    (*learned_net_.UnsafeRawStringPointer())->clear();
  }
  if (_has_bits_[0 / 32] & 6u) {
    ::memset(&iter_, 0, reinterpret_cast<char*>(&current_step_) -
      reinterpret_cast<char*>(&iter_) + sizeof(current_step_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}